

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogFile.cpp
# Opt level: O1

void __thiscall AppendFile::append(AppendFile *this,char *logline,size_t len)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  size_t __n;
  
  sVar2 = fwrite_unlocked(logline,1,len,(FILE *)this->fp_);
  __n = len - sVar2;
  do {
    if (__n == 0) break;
    sVar3 = fwrite_unlocked(logline + sVar2,1,__n,(FILE *)this->fp_);
    if ((sVar3 == 0) && (iVar1 = ferror((FILE *)this->fp_), iVar1 != 0)) {
      append();
      iVar1 = 3;
    }
    else {
      sVar2 = sVar2 + sVar3;
      __n = len - sVar2;
      iVar1 = 0;
    }
  } while (iVar1 == 0);
  this->writtenBytes_ = this->writtenBytes_ + len;
  return;
}

Assistant:

void AppendFile::append(const char* logline, const size_t len) {
    size_t n = write(logline, len);
    size_t remain = len - n;
    while (remain > 0) {
        size_t x = write(logline + n, remain);
        if (x == 0) {
           int err = ferror(fp_);
           if (err) {
               fprintf(stderr, "AppendFile::append() failed!\n");
               break;
           }
        }
        n += x;
        remain = len - n;
    }
    writtenBytes_ += len;
}